

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::ValidateSegment<double>(SparseArraySegment<double> *seg)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SparseArraySegmentBase **ppSVar4;
  uint local_14;
  SparseArraySegment<double> *pSStack_10;
  uint32 i;
  SparseArraySegment<double> *seg_local;
  
  pSStack_10 = seg;
  if ((Configuration::Global & 1) != 0) {
    while (pSStack_10 != (SparseArraySegment<double> *)0x0) {
      for (local_14 = (pSStack_10->super_SparseArraySegmentBase).length;
          local_14 < (pSStack_10->super_SparseArraySegmentBase).size; local_14 = local_14 + 1) {
        bVar2 = SparseArraySegment<double>::IsMissingItem
                          ((double *)
                           (&pSStack_10[1].super_SparseArraySegmentBase.left + (ulong)local_14 * 2))
        ;
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x2ede,
                                      "(SparseArraySegment<T>::IsMissingItem(&seg->elements[i]))",
                                      "Non missing value the end of the segment");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
      }
      ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&(pSStack_10->super_SparseArraySegmentBase).next);
      pSStack_10 = SparseArraySegment<double>::From(*ppSVar4);
    }
  }
  return;
}

Assistant:

void JavascriptArray::ValidateSegment(SparseArraySegment<T>* seg)
    {
        if (!Js::Configuration::Global.flags.ArrayValidate)
        {
            return;
        }

        while (seg)
        {
            uint32 i = seg->length;
            while (i < seg->size)
            {
                AssertMsg(SparseArraySegment<T>::IsMissingItem(&seg->elements[i]), "Non missing value the end of the segment");
                i++;
            }

            seg = SparseArraySegment<T>::From(seg->next);
        }
    }